

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::ExpressionResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info)

{
  string *__rhs;
  string *__lhs;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = &bStack_128;
  __lhs = &(this->m_exprComponents).op;
  bVar3 = std::operator==(__lhs,"");
  if (bVar3) {
    if ((this->m_exprComponents).lhs._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&info->capturedExpression);
    }
    else {
      std::operator+(__return_storage_ptr__,__lhs,&(this->m_exprComponents).lhs);
    }
  }
  else {
    bVar3 = std::operator==(__lhs,"matches");
    if (bVar3) {
      std::operator+(&bStack_128,&(this->m_exprComponents).lhs," ");
      std::operator+(__return_storage_ptr__,&bStack_128,&(this->m_exprComponents).rhs);
    }
    else {
      bVar3 = std::operator!=(__lhs,"!");
      if (bVar3) {
        __rhs = &(this->m_exprComponents).lhs;
        uVar1 = (this->m_exprComponents).lhs._M_string_length;
        uVar2 = (this->m_exprComponents).rhs._M_string_length;
        __rhs_00 = &(this->m_exprComponents).rhs;
        if (uVar2 + uVar1 < 0x1e) {
          std::operator+(&local_e8,__rhs," ");
          std::operator+(&local_108,&local_e8,__lhs);
          std::operator+(&bStack_128,&local_108," ");
          std::operator+(__return_storage_ptr__,&bStack_128,__rhs_00);
          std::__cxx11::string::~string((string *)&bStack_128);
          std::__cxx11::string::~string((string *)&local_108);
          this_00 = &local_e8;
        }
        else if (uVar2 < 0x46 && uVar1 < 0x46) {
          std::operator+(&local_c8,"\n\t",__rhs);
          std::operator+(&local_e8,&local_c8,"\n\t");
          std::operator+(&local_108,&local_e8,__lhs);
          std::operator+(&bStack_128,&local_108,"\n\t");
          std::operator+(__return_storage_ptr__,&bStack_128,__rhs_00);
          std::__cxx11::string::~string((string *)&bStack_128);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          this_00 = &local_c8;
        }
        else {
          std::operator+(&local_a8,"\n",__rhs);
          std::operator+(&local_c8,&local_a8,"\n");
          std::operator+(&local_e8,&local_c8,__lhs);
          std::operator+(&local_108,&local_e8,"\n");
          std::operator+(&bStack_128,&local_108,__rhs_00);
          std::operator+(__return_storage_ptr__,&bStack_128,"\n\n");
          std::__cxx11::string::~string((string *)&bStack_128);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_c8);
          this_00 = &local_a8;
        }
      }
      else {
        std::operator+(&local_48,"{can\'t expand - use ",&info->macroName);
        std::operator+(&local_68,&local_48,"_FALSE( ");
        std::__cxx11::string::substr((ulong)&local_88,(ulong)&info->capturedExpression);
        std::operator+(&local_a8,&local_68,&local_88);
        std::operator+(&local_c8,&local_a8," ) instead of ");
        std::operator+(&local_e8,&local_c8,&info->macroName);
        std::operator+(&local_108,&local_e8,"( ");
        std::operator+(&bStack_128,&local_108,&info->capturedExpression);
        std::operator+(__return_storage_ptr__,&bStack_128," ) for better diagnostics}");
        std::__cxx11::string::~string((string *)&bStack_128);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
        this_00 = &local_48;
      }
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionResultBuilder::reconstructExpression( const AssertionInfo& info ) const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? info.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 30 )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else if( m_exprComponents.lhs.size() < 70 && m_exprComponents.rhs.size() < 70 )
                return "\n\t" + m_exprComponents.lhs + "\n\t" + m_exprComponents.op + "\n\t" + m_exprComponents.rhs;
            else
                return "\n" + m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs + "\n\n";
        }
        else
            return "{can't expand - use " + info.macroName + "_FALSE( " + info.capturedExpression.substr(1) + " ) instead of " + info.macroName + "( " + info.capturedExpression + " ) for better diagnostics}";
    }